

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  long lVar7;
  xmlChar *sysID_00;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  xmlCatalogEntryPtr pxVar11;
  _xmlCatalogEntry *p_Var12;
  ulong uVar13;
  _xmlCatalogEntry *catal_00;
  ulong uVar14;
  uint local_1fc;
  xmlCatalogEntryPtr local_1e0;
  xmlChar *delegates [50];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar4 = xmlCatalogNormalizePublic(pubID);
    if ((pxVar4 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar4 != '\0')) {
      pubID = pxVar4;
    }
    iVar2 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar2 == 0) {
      pxVar6 = xmlCatalogUnWrapURN(pubID);
      if (xmlDebugCatalogs != 0) {
        if (pxVar6 == (xmlChar *)0x0) {
          pcVar10 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar10 = "Public URN ID expanded to %s\n";
          pubID = pxVar6;
        }
        xmlCatalogPrintDebug(pcVar10,pubID);
      }
      pxVar5 = xmlCatalogListXMLResolve(catal,pxVar6,sysID);
      if (pxVar6 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6);
      }
    }
    else {
      iVar2 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
      if (iVar2 == 0) {
        pxVar6 = xmlCatalogUnWrapURN(sysID);
        if (xmlDebugCatalogs != 0) {
          if (pxVar6 == (xmlChar *)0x0) {
            pcVar10 = "System URN ID %s expanded to NULL\n";
          }
          else {
            pcVar10 = "System URN ID expanded to %s\n";
            sysID = pxVar6;
          }
          xmlCatalogPrintDebug(pcVar10,sysID);
        }
        pxVar5 = pxVar6;
        if ((pubID == (xmlChar *)0x0) ||
           (iVar2 = xmlStrEqual(pubID,pxVar6), sysID_00 = pxVar6, pxVar5 = pubID, iVar2 != 0)) {
          sysID_00 = (xmlChar *)0x0;
          pubID = pxVar5;
        }
        pxVar5 = xmlCatalogListXMLResolve(catal,pubID,sysID_00);
        if (pxVar6 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar6);
        }
      }
      else {
        for (; catal != (xmlCatalogEntryPtr)0x0; catal = catal->next) {
          if (catal->type == XML_CATA_CATALOG) {
            catal_00 = catal->children;
            if (catal_00 == (_xmlCatalogEntry *)0x0) {
              xmlFetchXMLCatalogFile(catal);
              catal_00 = catal->children;
              if (catal_00 == (_xmlCatalogEntry *)0x0) goto LAB_0015bdf7;
            }
            if (catal_00->depth < 0x33) {
              catal_00->depth = catal_00->depth + 1;
              if (sysID == (xmlChar *)0x0) {
                iVar2 = 0;
              }
              else {
                iVar9 = 0;
                iVar2 = 0;
                local_1e0 = (xmlCatalogEntryPtr)0x0;
                local_1fc = 0;
                for (p_Var12 = catal_00; p_Var12 != (xmlCatalogEntryPtr)0x0; p_Var12 = p_Var12->next
                    ) {
                  switch(p_Var12->type) {
                  case XML_CATA_NEXT_CATALOG:
                    iVar2 = iVar2 + 1;
                    break;
                  case XML_CATA_SYSTEM:
                    iVar3 = xmlStrEqual(sysID,p_Var12->name);
                    if (iVar3 != 0) {
                      if (xmlDebugCatalogs != 0) {
                        xmlCatalogPrintDebug
                                  ("Found system match %s, using %s\n",p_Var12->name,p_Var12->URL);
                      }
                      catal_00->depth = catal_00->depth + -1;
                      pxVar5 = xmlStrdup(p_Var12->URL);
                      goto LAB_0015bdda;
                    }
                    break;
                  case XML_CATA_REWRITE_SYSTEM:
                    uVar8 = xmlStrlen(p_Var12->name);
                    if (((int)local_1fc < (int)uVar8) &&
                       (iVar3 = xmlStrncmp(sysID,p_Var12->name,uVar8), iVar3 == 0)) {
                      local_1fc = uVar8;
                      local_1e0 = p_Var12;
                    }
                    break;
                  case XML_CATA_DELEGATE_SYSTEM:
                    pxVar5 = p_Var12->name;
                    iVar3 = xmlStrlen(pxVar5);
                    iVar3 = xmlStrncmp(sysID,pxVar5,iVar3);
                    iVar9 = iVar9 + (uint)(iVar3 == 0);
                  }
                }
                if (local_1e0 != (xmlCatalogEntryPtr)0x0) {
                  if (xmlDebugCatalogs != 0) {
                    xmlCatalogPrintDebug("Using rewriting rule %s\n");
                  }
                  pxVar5 = xmlStrdup(local_1e0->URL);
                  if (pxVar5 == (xmlChar *)0x0) {
                    pxVar5 = (xmlChar *)0x0;
                  }
                  else {
                    pxVar5 = xmlStrcat(pxVar5,sysID + local_1fc);
                  }
                  catal_00->depth = catal_00->depth + -1;
LAB_0015bdda:
                  if (pxVar5 == (xmlChar *)0x0) goto LAB_0015bde8;
                  goto LAB_0015bee6;
                }
                if (iVar9 != 0) {
                  uVar8 = 0;
                  p_Var12 = catal_00;
                  goto LAB_0015c010;
                }
              }
              if (pubID != (xmlChar *)0x0) {
                iVar9 = 0;
                for (p_Var12 = catal_00; p_Var12 != (xmlCatalogEntryPtr)0x0; p_Var12 = p_Var12->next
                    ) {
                  xVar1 = p_Var12->type;
                  if (xVar1 == XML_CATA_NEXT_CATALOG) {
                    iVar2 = iVar2 + (uint)(sysID == (xmlChar *)0x0);
                  }
                  else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                    pxVar5 = p_Var12->name;
                    iVar3 = xmlStrlen(pxVar5);
                    iVar3 = xmlStrncmp(pubID,pxVar5,iVar3);
                    if (iVar3 == 0) {
                      iVar9 = iVar9 + (uint)(p_Var12->prefer == XML_CATA_PREFER_PUBLIC);
                    }
                  }
                  else if ((xVar1 == XML_CATA_PUBLIC) &&
                          (iVar3 = xmlStrEqual(pubID,p_Var12->name), iVar3 != 0)) {
                    if (xmlDebugCatalogs != 0) {
                      xmlCatalogPrintDebug("Found public match %s\n");
                    }
                    catal_00->depth = catal_00->depth + -1;
                    pxVar5 = xmlStrdup(p_Var12->URL);
                    goto LAB_0015bdda;
                  }
                }
                if (iVar9 != 0) {
                  uVar8 = 0;
                  p_Var12 = catal_00;
                  goto LAB_0015bf1b;
                }
              }
              p_Var12 = catal_00;
              if (iVar2 != 0) {
                for (; p_Var12 != (xmlCatalogEntryPtr)0x0; p_Var12 = p_Var12->next) {
                  if (p_Var12->type == XML_CATA_NEXT_CATALOG) {
                    pxVar11 = p_Var12->children;
                    if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
                      xmlFetchXMLCatalogFile(p_Var12);
                      pxVar11 = p_Var12->children;
                      if (pxVar11 == (xmlCatalogEntryPtr)0x0) goto LAB_0015bd5e;
                    }
                    pxVar5 = xmlCatalogListXMLResolve(pxVar11,pubID,sysID);
                    if (pxVar5 != (xmlChar *)0x0) {
                      catal_00->depth = catal_00->depth + -1;
                      goto LAB_0015bee6;
                    }
                    if (0x32 < catal_00->depth) goto LAB_0015bde8;
                  }
LAB_0015bd5e:
                }
              }
              catal_00->depth = catal_00->depth + -1;
            }
            else {
              xmlCatalogErr(catal_00,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                            catal_00->name,(xmlChar *)0x0,(xmlChar *)0x0);
            }
LAB_0015bde8:
            if (0x32 < catal->children->depth) break;
          }
LAB_0015bdf7:
        }
        pxVar5 = (xmlChar *)0x0;
      }
    }
LAB_0015bee6:
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
  }
  return pxVar5;
LAB_0015c010:
  uVar14 = 0;
  if (0 < (int)uVar8) {
    uVar14 = (ulong)uVar8;
  }
  for (; pxVar5 = (xmlChar *)0xffffffffffffffff, p_Var12 != (xmlCatalogEntryPtr)0x0;
      p_Var12 = p_Var12->next) {
    if (p_Var12->type != XML_CATA_DELEGATE_SYSTEM) goto LAB_0015c0cb;
    pxVar5 = p_Var12->name;
    iVar2 = xmlStrlen(pxVar5);
    iVar2 = xmlStrncmp(sysID,pxVar5,iVar2);
    if (iVar2 != 0) goto LAB_0015c0cb;
    uVar13 = 0;
    do {
      if (uVar14 == uVar13) {
        if ((int)uVar8 < 0x32) {
          lVar7 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          delegates[lVar7] = p_Var12->URL;
        }
        pxVar11 = p_Var12->children;
        if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
          xmlFetchXMLCatalogFile(p_Var12);
          pxVar11 = p_Var12->children;
          if (pxVar11 == (xmlCatalogEntryPtr)0x0) goto LAB_0015c0cb;
        }
        if (xmlDebugCatalogs != 0) {
          xmlCatalogPrintDebug("Trying system delegate %s\n");
          pxVar11 = p_Var12->children;
        }
        pxVar5 = xmlCatalogListXMLResolve(pxVar11,(xmlChar *)0x0,sysID);
        if (pxVar5 == (xmlChar *)0x0) goto LAB_0015c0cb;
        goto LAB_0015c0e3;
      }
      iVar2 = xmlStrEqual(p_Var12->URL,delegates[uVar13]);
      uVar13 = uVar13 + 1;
    } while (iVar2 == 0);
  }
LAB_0015c0e3:
  catal_00->depth = catal_00->depth + -1;
  goto LAB_0015bee6;
LAB_0015c0cb:
  p_Var12 = p_Var12->next;
  goto LAB_0015c010;
LAB_0015bf1b:
  uVar14 = 0;
  if (0 < (int)uVar8) {
    uVar14 = (ulong)uVar8;
  }
  for (; pxVar5 = (xmlChar *)0xffffffffffffffff, p_Var12 != (xmlCatalogEntryPtr)0x0;
      p_Var12 = p_Var12->next) {
    if ((p_Var12->type != XML_CATA_DELEGATE_PUBLIC) || (p_Var12->prefer != XML_CATA_PREFER_PUBLIC))
    goto LAB_0015bfee;
    pxVar5 = p_Var12->name;
    iVar2 = xmlStrlen(pxVar5);
    iVar2 = xmlStrncmp(pubID,pxVar5,iVar2);
    if (iVar2 != 0) goto LAB_0015bfee;
    uVar13 = 0;
    do {
      if (uVar14 == uVar13) {
        if ((int)uVar8 < 0x32) {
          lVar7 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          delegates[lVar7] = p_Var12->URL;
        }
        pxVar11 = p_Var12->children;
        if (pxVar11 == (xmlCatalogEntryPtr)0x0) {
          xmlFetchXMLCatalogFile(p_Var12);
          pxVar11 = p_Var12->children;
          if (pxVar11 == (xmlCatalogEntryPtr)0x0) goto LAB_0015bfee;
        }
        if (xmlDebugCatalogs != 0) {
          xmlCatalogPrintDebug("Trying public delegate %s\n",p_Var12->URL);
          pxVar11 = p_Var12->children;
        }
        pxVar5 = xmlCatalogListXMLResolve(pxVar11,pubID,(xmlChar *)0x0);
        if (pxVar5 == (xmlChar *)0x0) goto LAB_0015bfee;
        goto LAB_0015c0d7;
      }
      iVar2 = xmlStrEqual(p_Var12->URL,delegates[uVar13]);
      uVar13 = uVar13 + 1;
    } while (iVar2 == 0);
  }
LAB_0015c0d7:
  catal_00->depth = catal_00->depth + -1;
  goto LAB_0015bee6;
LAB_0015bfee:
  p_Var12 = p_Var12->next;
  goto LAB_0015bf1b;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlCatalogPrintDebug(
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlCatalogPrintDebug(
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}